

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPat.c
# Opt level: O0

void Gia_SatVerifyPattern(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vCex,Vec_Int_t *vVisit)

{
  int iVar1;
  int fCompl0;
  int fCompl1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int Value1;
  int Value0;
  int Value;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVisit_local;
  Vec_Int_t *vCex_local;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCo(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCo(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                  ,0x61,
                  "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  pGVar3 = Gia_ObjFanin0(pRoot);
  iVar1 = Gia_ObjIsConst0(pGVar3);
  if (iVar1 == 0) {
    pGVar3 = Gia_ObjFanin0(pRoot);
    Gia_SatCollectCone(p,pGVar3,vVisit);
    for (Value = 0; iVar1 = Vec_IntSize(vCex), Value < iVar1; Value = Value + 1) {
      iVar1 = Vec_IntEntry(vCex,Value);
      iVar2 = Abc_Lit2Var(iVar1);
      pGVar3 = Gia_ManCi(p,iVar2);
      iVar2 = Abc_LitIsCompl(iVar1);
      iVar1 = 2;
      if (iVar2 != 0) {
        iVar1 = 1;
      }
      Sat_ObjSetXValue(pGVar3,iVar1);
    }
    Value = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vVisit);
      bVar4 = false;
      if (Value < iVar1) {
        iVar1 = Vec_IntEntry(vVisit,Value);
        _Entry = Gia_ManObj(p,iVar1);
        bVar4 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsCi(_Entry);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(_Entry);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                        ,0x6e,
                        "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        pGVar3 = Gia_ObjFanin0(_Entry);
        iVar1 = Sat_ObjXValue(pGVar3);
        pGVar3 = Gia_ObjFanin1(_Entry);
        iVar2 = Sat_ObjXValue(pGVar3);
        fCompl0 = Gia_ObjFaninC0(_Entry);
        fCompl1 = Gia_ObjFaninC1(_Entry);
        iVar1 = Gia_XsimAndCond(iVar1,fCompl0,iVar2,fCompl1);
        Sat_ObjSetXValue(_Entry,iVar1);
      }
      Value = Value + 1;
    }
    pGVar3 = Gia_ObjFanin0(pRoot);
    iVar1 = Sat_ObjXValue(pGVar3);
    iVar2 = Gia_ObjFaninC0(pRoot);
    iVar1 = Gia_XsimNotCond(iVar1,iVar2);
    if (iVar1 != 2) {
      printf("Gia_SatVerifyPattern(): Verification FAILED.\n");
    }
    Value = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vVisit);
      bVar4 = false;
      if (Value < iVar1) {
        iVar1 = Vec_IntEntry(vVisit,Value);
        _Entry = Gia_ManObj(p,iVar1);
        bVar4 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      Sat_ObjSetXValue(_Entry,0);
      Value = Value + 1;
    }
    return;
  }
  __assert_fail("!Gia_ObjIsConst0(Gia_ObjFanin0(pRoot))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                ,0x62,
                "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Gia_SatVerifyPattern( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vCex, Vec_Int_t * vVisit )
{
    Gia_Obj_t * pObj;
    int i, Entry, Value, Value0, Value1;
    assert( Gia_ObjIsCo(pRoot) );
    assert( !Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) );
    // collect nodes and initialized them to x
    Gia_SatCollectCone( p, Gia_ObjFanin0(pRoot), vVisit );
    // set binary values to nodes in the counter-example
    Vec_IntForEachEntry( vCex, Entry, i )
//        Sat_ObjSetXValue( Gia_ManObj(p, Abc_Lit2Var(Entry)), Abc_LitIsCompl(Entry)? GIA_ZER : GIA_ONE );
        Sat_ObjSetXValue( Gia_ManCi(p, Abc_Lit2Var(Entry)), Abc_LitIsCompl(Entry)? GIA_ZER : GIA_ONE );
    // simulate
    Gia_ManForEachObjVec( vVisit, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        Value0 = Sat_ObjXValue( Gia_ObjFanin0(pObj) );
        Value1 = Sat_ObjXValue( Gia_ObjFanin1(pObj) );
        Value = Gia_XsimAndCond( Value0, Gia_ObjFaninC0(pObj), Value1, Gia_ObjFaninC1(pObj) );
        Sat_ObjSetXValue( pObj, Value );
    }
    Value = Sat_ObjXValue( Gia_ObjFanin0(pRoot) );
    Value = Gia_XsimNotCond( Value, Gia_ObjFaninC0(pRoot) );
    if ( Value != GIA_ONE )
        printf( "Gia_SatVerifyPattern(): Verification FAILED.\n" );
//    else
//        printf( "Gia_SatVerifyPattern(): Verification succeeded.\n" );
//    assert( Value == GIA_ONE );
    // clean the nodes
    Gia_ManForEachObjVec( vVisit, p, pObj, i )
        Sat_ObjSetXValue( pObj, 0 );
}